

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::Star(Compiler *this,Frag a,bool nongreedy)

{
  Inst *pIVar1;
  uint val;
  ulong uVar2;
  
  val = AllocInst(this,1);
  if ((int)val < 0) {
    uVar2 = 0;
    val = 0;
  }
  else {
    Prog::Inst::InitAlt(this->inst_ + val,0,0);
    PatchList::Patch(this->inst_,a.end.p,val);
    pIVar1 = this->inst_;
    if (nongreedy) {
      pIVar1[val].field_1.out1_ = a.begin;
      uVar2 = (ulong)(val * 2);
    }
    else {
      pIVar1[val].out_opcode_ = pIVar1[val].out_opcode_ & 0xf | a.begin << 4;
      uVar2 = (ulong)(val * 2 + 1);
    }
  }
  return (Frag)((ulong)val | uVar2 << 0x20);
}

Assistant:

Frag Compiler::Star(Frag a, bool nongreedy) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitAlt(0, 0);
  PatchList::Patch(inst_, a.end, id);
  if (nongreedy) {
    inst_[id].out1_ = a.begin;
    return Frag(id, PatchList::Mk(id << 1));
  } else {
    inst_[id].set_out(a.begin);
    return Frag(id, PatchList::Mk((id << 1) | 1));
  }
}